

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

void LoadFunction(LoadState *S,Proto *f)

{
  int iVar1;
  uint uVar2;
  Instruction *b;
  TValue *pTVar3;
  Proto **ppPVar4;
  ulong uVar5;
  Proto *pPVar6;
  Upvaldesc *pUVar7;
  TString *pTVar8;
  int *b_00;
  LocVar *pLVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  char x_6;
  char x_7;
  char x_4;
  char x_3;
  char x;
  char x_1;
  char x_2;
  lua_Number x_5;
  lu_byte local_3f;
  lu_byte local_3e;
  char local_3d;
  byte local_3c;
  lu_byte local_3b;
  lu_byte local_3a;
  lu_byte local_39;
  undefined8 local_38;
  
  iVar1 = LoadInt(S);
  f->linedefined = iVar1;
  iVar1 = LoadInt(S);
  f->lastlinedefined = iVar1;
  LoadBlock(S,&local_3b,1);
  f->numparams = local_3b;
  LoadBlock(S,&local_3a,1);
  f->is_vararg = local_3a;
  LoadBlock(S,&local_39,1);
  f->maxstacksize = local_39;
  uVar2 = LoadInt(S);
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,(ulong)uVar2 << 2);
  f->code = b;
  f->sizecode = uVar2;
  LoadBlock(S,b,(ulong)uVar2 << 2);
  uVar2 = LoadInt(S);
  uVar12 = (ulong)uVar2;
  pTVar3 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,uVar12 << 4);
  f->k = pTVar3;
  f->sizek = uVar2;
  if (uVar2 != 0) {
    lVar11 = 0;
    do {
      *(undefined4 *)((long)&pTVar3->tt_ + lVar11) = 0;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 << 4 != lVar11);
    lVar11 = 0;
    do {
      pTVar3 = f->k;
      LoadBlock(S,&local_3c,1);
      uVar2 = (uint)local_3c;
      switch(local_3c) {
      case 0:
        break;
      case 1:
        LoadBlock(S,&local_3d,1);
        *(int *)((long)&pTVar3->value_ + lVar11) = (int)local_3d;
        uVar2 = 1;
        break;
      default:
        goto switchD_00110eb7_caseD_2;
      case 3:
        LoadBlock(S,&local_38,8);
        *(undefined8 *)((long)&pTVar3->value_ + lVar11) = local_38;
        uVar2 = 3;
        break;
      case 4:
        pTVar8 = LoadString(S);
        *(TString **)((long)&pTVar3->value_ + lVar11) = pTVar8;
        uVar2 = (pTVar8->tsv).tt | 0x40;
      }
      *(uint *)((long)&pTVar3->tt_ + lVar11) = uVar2;
switchD_00110eb7_caseD_2:
      lVar11 = lVar11 + 0x10;
    } while (uVar12 << 4 != lVar11);
  }
  uVar2 = LoadInt(S);
  uVar12 = (ulong)uVar2;
  ppPVar4 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,uVar12 * 8);
  f->p = ppPVar4;
  f->sizep = uVar2;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      f->p[uVar5] = (Proto *)0x0;
      uVar5 = uVar5 + 1;
    } while (uVar12 != uVar5);
    uVar5 = 0;
    do {
      pPVar6 = luaF_newproto(S->L);
      f->p[uVar5] = pPVar6;
      LoadFunction(S,f->p[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar12 != uVar5);
  }
  uVar2 = LoadInt(S);
  sVar13 = (ulong)uVar2 << 4;
  pUVar7 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,sVar13);
  f->upvalues = pUVar7;
  f->sizeupvalues = uVar2;
  if (uVar2 != 0) {
    sVar10 = 0;
    do {
      *(undefined8 *)((long)&pUVar7->name + sVar10) = 0;
      sVar10 = sVar10 + 0x10;
    } while (sVar13 != sVar10);
    sVar10 = 0;
    do {
      LoadBlock(S,&local_3f,1);
      (&f->upvalues->instack)[sVar10] = local_3f;
      LoadBlock(S,&local_3e,1);
      (&f->upvalues->idx)[sVar10] = local_3e;
      sVar10 = sVar10 + 0x10;
    } while (sVar13 != sVar10);
  }
  pTVar8 = LoadString(S);
  f->source = pTVar8;
  uVar2 = LoadInt(S);
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,(ulong)uVar2 << 2);
  f->lineinfo = b_00;
  f->sizelineinfo = uVar2;
  LoadBlock(S,b_00,(ulong)uVar2 << 2);
  uVar2 = LoadInt(S);
  sVar13 = (ulong)uVar2 << 4;
  pLVar9 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,sVar13);
  f->locvars = pLVar9;
  f->sizelocvars = uVar2;
  if (uVar2 != 0) {
    sVar10 = 0;
    do {
      *(undefined8 *)((long)&pLVar9->varname + sVar10) = 0;
      sVar10 = sVar10 + 0x10;
    } while (sVar13 != sVar10);
    sVar10 = 0;
    do {
      pTVar8 = LoadString(S);
      *(TString **)((long)&f->locvars->varname + sVar10) = pTVar8;
      iVar1 = LoadInt(S);
      *(int *)((long)&f->locvars->startpc + sVar10) = iVar1;
      iVar1 = LoadInt(S);
      *(int *)((long)&f->locvars->endpc + sVar10) = iVar1;
      sVar10 = sVar10 + 0x10;
    } while (sVar13 != sVar10);
  }
  uVar2 = LoadInt(S);
  if (uVar2 != 0) {
    lVar11 = 0;
    do {
      pTVar8 = LoadString(S);
      *(TString **)((long)&f->upvalues->name + lVar11) = pTVar8;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar11);
  }
  return;
}

Assistant:

static void LoadFunction(LoadState* S, Proto* f)
{
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadUpvalues(S,f);
 LoadDebug(S,f);
}